

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::weakly_canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  path result;
  error_code tec;
  path pe;
  iterator __begin2;
  iterator __end2;
  path local_158;
  error_category *local_138;
  long *local_130 [2];
  long local_120 [2];
  error_code local_110;
  const_iterator local_100 [2];
  long local_f0 [2];
  path local_e0;
  undefined1 local_c0 [32];
  const_iterator local_a0;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  iterator local_78;
  
  local_158._path._M_dataplus._M_p = (pointer)&local_158._path.field_2;
  local_158._path._M_string_length = 0;
  local_158._path.field_2._M_local_buf[0] = '\0';
  local_138 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = local_138;
  local_78._first._M_current = (p->_path)._M_dataplus._M_p;
  path::iterator::iterator((iterator *)local_c0,p,&local_78._first);
  local_100[0]._M_current = (p->_path)._M_dataplus._M_p + (p->_path)._M_string_length;
  path::iterator::iterator(&local_78,p,local_100);
  paVar3 = &(__return_storage_ptr__->_path).field_2;
  bVar1 = true;
  while (local_a0._M_current != local_78._iter._M_current) {
    local_100[0]._M_current = (char *)local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_98._M_p,local_98._M_p + local_90);
    if (bVar1) {
      local_110._M_value = 0;
      local_110._M_cat = local_138;
      operator/((path *)local_130,&local_158,(path *)local_100);
      bVar2 = exists((path *)local_130,&local_110);
      if (local_130[0] != local_120) {
        operator_delete(local_130[0],local_120[0] + 1);
      }
      if (bVar2) {
        cVar4 = '\0';
        path::operator/=(&local_158,(path *)local_100);
      }
      else if (ec->_M_value == 0) {
        if (local_158._path._M_string_length == 0) {
          bVar1 = false;
          path::operator/=(&local_158,(path *)local_100);
          cVar4 = '\0';
        }
        else {
          canonical(&local_e0,&local_158,ec);
          operator/((path *)local_130,&local_e0,(path *)local_100);
          std::__cxx11::string::operator=((string *)&local_158,(string *)local_130);
          if (local_130[0] != local_120) {
            operator_delete(local_130[0],local_120[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._path._M_dataplus._M_p != &local_e0._path.field_2) {
            operator_delete(local_e0._path._M_dataplus._M_p,
                            local_e0._path.field_2._M_allocated_capacity + 1);
          }
          cVar4 = (ec->_M_value != 0) * '\x02';
          bVar1 = false;
        }
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar3;
        (__return_storage_ptr__->_path)._M_string_length = 0;
        (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
        cVar4 = '\x01';
      }
    }
    else {
      cVar4 = '\0';
      path::operator/=(&local_158,(path *)local_100);
    }
    if ((long *)local_100[0]._M_current != local_f0) {
      operator_delete(local_100[0]._M_current,local_f0[0] + 1);
    }
    if (cVar4 != '\0') goto LAB_001dbae9;
    path::iterator::operator++((iterator *)local_c0);
  }
  cVar4 = '\x02';
LAB_001dbae9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._current._path._M_dataplus._M_p != &local_78._current._path.field_2) {
    operator_delete(local_78._current._path._M_dataplus._M_p,
                    local_78._current._path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  if (cVar4 == '\x02') {
    if ((bVar1) && (local_158._path._M_string_length != 0)) {
      canonical((path *)local_c0,&local_158,ec);
      std::__cxx11::string::operator=((string *)&local_158,(string *)local_c0);
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
      }
    }
    if (ec->_M_value == 0) {
      path::lexically_normal(__return_storage_ptr__,&local_158);
    }
    else {
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar3;
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._path._M_dataplus._M_p != &local_158._path.field_2) {
    operator_delete(local_158._path._M_dataplus._M_p,
                    CONCAT71(local_158._path.field_2._M_allocated_capacity._1_7_,
                             local_158._path.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path weakly_canonical(const path& p, std::error_code& ec) noexcept
{
    path result;
    ec.clear();
    bool scan = true;
    for (auto pe : p) {
        if (scan) {
            std::error_code tec;
            if (exists(result / pe, tec)) {
                result /= pe;
            }
            else {
                if (ec) {
                    return path();
                }
                scan = false;
                if (!result.empty()) {
                    result = canonical(result, ec) / pe;
                    if (ec) {
                        break;
                    }
                }
                else {
                    result /= pe;
                }
            }
        }
        else {
            result /= pe;
        }
    }
    if (scan) {
        if (!result.empty()) {
            result = canonical(result, ec);
        }
    }
    return ec ? path() : result.lexically_normal();
}